

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglResizeTests.cpp
# Opt level: O3

bool deqp::egl::compareRectangles(ConstPixelBufferAccess *rectA,ConstPixelBufferAccess *rectB)

{
  ulong uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  bool bVar7;
  ulong uVar8;
  int z;
  int iVar9;
  int y;
  float local_50;
  float afStack_4c [4];
  float afStack_3c [3];
  
  iVar2 = (rectA->m_size).m_data[0];
  bVar7 = false;
  if (((((rectB->m_size).m_data[0] == iVar2) &&
       (iVar3 = (rectA->m_size).m_data[1], bVar7 = false, (rectB->m_size).m_data[1] == iVar3)) &&
      (iVar4 = (rectA->m_size).m_data[2], bVar7 = false, (rectB->m_size).m_data[2] == iVar4)) &&
     (bVar7 = true, 0 < iVar4)) {
    iVar9 = 0;
    do {
      if (0 < iVar3) {
        z = 0;
        do {
          if (0 < iVar2) {
            y = 0;
            do {
              tcu::ConstPixelBufferAccess::getPixel
                        ((ConstPixelBufferAccess *)(afStack_4c + 3),(int)rectA,y,z);
              tcu::ConstPixelBufferAccess::getPixel
                        ((ConstPixelBufferAccess *)&local_50,(int)rectB,y,z);
              if ((afStack_4c[3] != local_50) || (NAN(afStack_4c[3]) || NAN(local_50))) {
                return false;
              }
              uVar8 = 0xffffffffffffffff;
              do {
                if (uVar8 == 2) goto LAB_00e39f02;
                lVar5 = uVar8 + 5;
                uVar1 = uVar8 + 1;
                lVar6 = uVar8 + 1;
              } while ((afStack_4c[lVar5] == afStack_4c[lVar6]) &&
                      (uVar8 = uVar1, !NAN(afStack_4c[lVar5]) && !NAN(afStack_4c[lVar6])));
              if (uVar1 < 3) {
                return false;
              }
LAB_00e39f02:
              y = y + 1;
            } while (y != iVar2);
          }
          z = z + 1;
        } while (z != iVar3);
      }
      iVar9 = iVar9 + 1;
    } while (iVar9 != iVar4);
    bVar7 = true;
  }
  return bVar7;
}

Assistant:

virtual EGLenum				surfaceType	(void) const { return EGL_WINDOW_BIT; }